

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::NetworkUpdateParameters::ByteSizeLong(NetworkUpdateParameters *this)

{
  uint uVar1;
  Type *value;
  size_t sVar2;
  uint i;
  uint index;
  ulong uVar3;
  
  uVar1 = (this->losslayers_).super_RepeatedPtrFieldBase.current_size_;
  uVar3 = (ulong)uVar1;
  for (index = 0; uVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(this->losslayers_).super_RepeatedPtrFieldBase,index);
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::LossLayer>(value);
    uVar3 = uVar3 + sVar2;
  }
  if (this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_ &&
      this->optimizer_ != (Optimizer *)0x0) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Optimizer>(this->optimizer_);
    uVar3 = uVar3 + sVar2 + 1;
  }
  if (this->epochs_ != (Int64Parameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Parameter>(this->epochs_);
    uVar3 = uVar3 + sVar2 + 1;
  }
  if (this->shuffle_ != (BoolParameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BoolParameter>(this->shuffle_);
    uVar3 = uVar3 + sVar2 + 1;
  }
  if (this->seed_ != (Int64Parameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Parameter>(this->seed_);
    uVar3 = uVar3 + sVar2 + 2;
  }
  this->_cached_size_ = (int)uVar3;
  return uVar3;
}

Assistant:

size_t NetworkUpdateParameters::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NetworkUpdateParameters)
  size_t total_size = 0;

  // repeated .CoreML.Specification.LossLayer lossLayers = 1;
  {
    unsigned int count = this->losslayers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->losslayers(i));
    }
  }

  // .CoreML.Specification.Optimizer optimizer = 2;
  if (this->has_optimizer()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->optimizer_);
  }

  // .CoreML.Specification.Int64Parameter epochs = 3;
  if (this->has_epochs()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->epochs_);
  }

  // .CoreML.Specification.BoolParameter shuffle = 10;
  if (this->has_shuffle()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->shuffle_);
  }

  // .CoreML.Specification.Int64Parameter seed = 20;
  if (this->has_seed()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->seed_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}